

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

date_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
          (DateTruncBinaryOperator *this,string_t specifier,timestamp_t date)

{
  undefined1 uVar1;
  bool bVar2;
  date_t dVar3;
  NotImplementedException *this_00;
  timestamp_t input;
  long lVar4;
  undefined1 auVar5 [16];
  date_t result;
  date_t local_7c;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined8 local_38;
  long local_30;
  
  input.value = specifier.value._8_8_;
  local_30 = specifier.value._0_8_;
  lVar4 = local_30;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_38 + 4;
  }
  local_58[0] = local_48;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,lVar4,((ulong)this & 0xffffffff) + lVar4);
  uVar1 = duckdb::GetDatePartSpecifier((string *)local_58);
  bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar2) {
    switch(uVar1) {
    case 0:
      local_7c = DateTrunc::YearOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 1:
      local_7c = DateTrunc::MonthOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 2:
    case 6:
    case 0xb:
    case 0xc:
    case 0x10:
    case 0x17:
      local_7c.days = duckdb::Timestamp::GetDate(input);
      break;
    case 3:
      local_7c = DateTrunc::DecadeOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 4:
      local_7c = DateTrunc::CenturyOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 5:
      local_7c = DateTrunc::MillenniumOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input)
      ;
      break;
    case 7:
      local_7c = DateTrunc::MillisecondOperator::Operation<duckdb::timestamp_t,duckdb::date_t>
                           (input);
      break;
    case 8:
    case 0x16:
      local_7c = DateTrunc::SecondOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 9:
      local_7c = DateTrunc::MinuteOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 10:
      local_7c = DateTrunc::HourOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 0xd:
    case 0x11:
      dVar3.days = duckdb::Timestamp::GetDate(input);
      local_7c.days = duckdb::Date::GetMondayOfCurrentWeek(dVar3);
      break;
    case 0xe:
      local_7c = DateTrunc::ISOYearOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    case 0xf:
      local_7c = DateTrunc::QuarterOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Specifier type not implemented for DATETRUNC","");
      duckdb::NotImplementedException::NotImplementedException(this_00,(string *)&local_78);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(input,&local_7c,false);
    if (!bVar2) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_78,(duckdb *)input.value,(timestamp_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_78);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return (date_t)local_7c.days;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}